

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParsePEReference(xmlParserCtxtPtr ctxt)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlCharEncoding enc_00;
  xmlChar *str1;
  int *piVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlChar local_2c;
  xmlChar local_2b;
  xmlChar local_2a;
  xmlChar local_29;
  xmlCharEncoding enc;
  xmlChar start [4];
  xmlParserInputPtr input;
  xmlEntityPtr entity;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  input = (xmlParserInputPtr)0x0;
  if (*ctxt->input->cur == '%') {
    xmlNextChar(ctxt);
    str1 = xmlParseName(ctxt);
    if (str1 == (xmlChar *)0x0) {
      xmlFatalErrMsg(ctxt,XML_ERR_PEREF_NO_NAME,"PEReference: no name\n");
    }
    else {
      piVar3 = __xmlParserDebugEntities();
      if (*piVar3 != 0) {
        pp_Var4 = __xmlGenericError();
        p_Var1 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar5,"PEReference: %s\n",str1);
      }
      if (*ctxt->input->cur == ';') {
        xmlNextChar(ctxt);
        ctxt->nbentities = ctxt->nbentities + 1;
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (ctxt->sax->getParameterEntity != (getParameterEntitySAXFunc)0x0)) {
          input = (xmlParserInputPtr)(*ctxt->sax->getParameterEntity)(ctxt->userData,str1);
        }
        if (ctxt->instate != XML_PARSER_EOF) {
          if (input == (xmlParserInputPtr)0x0) {
            if ((ctxt->standalone == 1) ||
               ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
              xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",str1
                               );
            }
            else {
              if ((ctxt->validate == 0) || ((ctxt->vctxt).error == (xmlValidityErrorFunc)0x0)) {
                xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",str1,
                              (xmlChar *)0x0);
              }
              else {
                xmlValidityError(ctxt,XML_WAR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",
                                 str1,(xmlChar *)0x0);
              }
              ctxt->valid = 0;
            }
            xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
          }
          else if ((*(int *)((long)&input->version + 4) == 4) ||
                  (*(int *)((long)&input->version + 4) == 5)) {
            iVar2 = xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)input,0);
            if (iVar2 != 0) {
              return;
            }
            if (((((*(int *)((long)&input->version + 4) == 5) && ((ctxt->options & 2U) == 0)) &&
                 ((ctxt->options & 0x10U) == 0)) &&
                (((ctxt->options & 4U) == 0 && ((ctxt->options & 8U) == 0)))) &&
               ((ctxt->replaceEntities == 0 && (ctxt->validate == 0)))) {
              return;
            }
            _enc = xmlNewEntityInputStream(ctxt,(xmlEntityPtr)input);
            iVar2 = xmlPushInput(ctxt,_enc);
            if (iVar2 < 0) {
              xmlFreeInputStream(_enc);
              return;
            }
            if (*(int *)((long)&input->version + 4) == 5) {
              if ((ctxt->progressive == 0) &&
                 ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                xmlGROW(ctxt);
              }
              if (ctxt->instate == XML_PARSER_EOF) {
                return;
              }
              if (3 < (long)ctxt->input->end - (long)ctxt->input->cur) {
                local_2c = *ctxt->input->cur;
                local_2b = ctxt->input->cur[1];
                local_2a = ctxt->input->cur[2];
                local_29 = ctxt->input->cur[3];
                enc_00 = xmlDetectCharEncoding(&local_2c,4);
                if (enc_00 != XML_CHAR_ENCODING_NONE) {
                  xmlSwitchEncoding(ctxt,enc_00);
                }
              }
              if (((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) &&
                   (ctxt->input->cur[2] == 'x')) &&
                  ((ctxt->input->cur[3] == 'm' && (ctxt->input->cur[4] == 'l')))) &&
                 (((ctxt->input->cur[5] == ' ' ||
                   ((8 < ctxt->input->cur[5] && (ctxt->input->cur[5] < 0xb)))) ||
                  (ctxt->input->cur[5] == '\r')))) {
                xmlParseTextDecl(ctxt);
              }
            }
          }
          else {
            xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,
                          "Internal: %%%s; is not a parameter entity\n",str1,(xmlChar *)0x0);
          }
          ctxt->hasPErefs = 1;
        }
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_PEREF_SEMICOL_MISSING,(char *)0x0);
      }
    }
  }
  return;
}

Assistant:

void
xmlParsePEReference(xmlParserCtxtPtr ctxt)
{
    const xmlChar *name;
    xmlEntityPtr entity = NULL;
    xmlParserInputPtr input;

    if (RAW != '%')
        return;
    NEXT;
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_PEREF_NO_NAME, "PEReference: no name\n");
	return;
    }
    if (xmlParserDebugEntities)
	xmlGenericError(xmlGenericErrorContext,
		"PEReference: %s\n", name);
    if (RAW != ';') {
	xmlFatalErr(ctxt, XML_ERR_PEREF_SEMICOL_MISSING, NULL);
        return;
    }

    NEXT;

    /*
     * Increase the number of entity references parsed
     */
    ctxt->nbentities++;

    /*
     * Request the entity from SAX
     */
    if ((ctxt->sax != NULL) &&
	(ctxt->sax->getParameterEntity != NULL))
	entity = ctxt->sax->getParameterEntity(ctxt->userData, name);
    if (ctxt->instate == XML_PARSER_EOF)
	return;
    if (entity == NULL) {
	/*
	 * [ WFC: Entity Declared ]
	 * In a document without any DTD, a document with only an
	 * internal DTD subset which contains no parameter entity
	 * references, or a document with "standalone='yes'", ...
	 * ... The declaration of a parameter entity must precede
	 * any reference to it...
	 */
	if ((ctxt->standalone == 1) ||
	    ((ctxt->hasExternalSubset == 0) &&
	     (ctxt->hasPErefs == 0))) {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_UNDECLARED_ENTITY,
			      "PEReference: %%%s; not found\n",
			      name);
	} else {
	    /*
	     * [ VC: Entity Declared ]
	     * In a document with an external subset or external
	     * parameter entities with "standalone='no'", ...
	     * ... The declaration of a parameter entity must
	     * precede any reference to it...
	     */
            if ((ctxt->validate) && (ctxt->vctxt.error != NULL)) {
                xmlValidityError(ctxt, XML_WAR_UNDECLARED_ENTITY,
                                 "PEReference: %%%s; not found\n",
                                 name, NULL);
            } else
                xmlWarningMsg(ctxt, XML_WAR_UNDECLARED_ENTITY,
                              "PEReference: %%%s; not found\n",
                              name, NULL);
            ctxt->valid = 0;
	}
	xmlParserEntityCheck(ctxt, 0, NULL, 0);
    } else {
	/*
	 * Internal checking in case the entity quest barfed
	 */
	if ((entity->etype != XML_INTERNAL_PARAMETER_ENTITY) &&
	    (entity->etype != XML_EXTERNAL_PARAMETER_ENTITY)) {
	    xmlWarningMsg(ctxt, XML_WAR_UNDECLARED_ENTITY,
		  "Internal: %%%s; is not a parameter entity\n",
			  name, NULL);
	} else {
            xmlChar start[4];
            xmlCharEncoding enc;

	    if (xmlParserEntityCheck(ctxt, 0, entity, 0))
	        return;

	    if ((entity->etype == XML_EXTERNAL_PARAMETER_ENTITY) &&
	        ((ctxt->options & XML_PARSE_NOENT) == 0) &&
		((ctxt->options & XML_PARSE_DTDVALID) == 0) &&
		((ctxt->options & XML_PARSE_DTDLOAD) == 0) &&
		((ctxt->options & XML_PARSE_DTDATTR) == 0) &&
		(ctxt->replaceEntities == 0) &&
		(ctxt->validate == 0))
		return;

	    input = xmlNewEntityInputStream(ctxt, entity);
	    if (xmlPushInput(ctxt, input) < 0) {
                xmlFreeInputStream(input);
		return;
            }

	    if (entity->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
                /*
                 * Get the 4 first bytes and decode the charset
                 * if enc != XML_CHAR_ENCODING_NONE
                 * plug some encoding conversion routines.
                 * Note that, since we may have some non-UTF8
                 * encoding (like UTF16, bug 135229), the 'length'
                 * is not known, but we can calculate based upon
                 * the amount of data in the buffer.
                 */
                GROW
                if (ctxt->instate == XML_PARSER_EOF)
                    return;
                if ((ctxt->input->end - ctxt->input->cur)>=4) {
                    start[0] = RAW;
                    start[1] = NXT(1);
                    start[2] = NXT(2);
                    start[3] = NXT(3);
                    enc = xmlDetectCharEncoding(start, 4);
                    if (enc != XML_CHAR_ENCODING_NONE) {
                        xmlSwitchEncoding(ctxt, enc);
                    }
                }

                if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) &&
                    (IS_BLANK_CH(NXT(5)))) {
                    xmlParseTextDecl(ctxt);
                }
            }
	}
    }
    ctxt->hasPErefs = 1;
}